

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half_perf_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__nptr;
  ushort uVar1;
  uint numentries;
  uint16_t *halfs;
  float *floats;
  ulong uVar2;
  int i;
  ulong uVar3;
  double dVar4;
  Rand48 r;
  
  numentries = 0x5eec00;
  if (1 < argc) {
    __nptr = argv[1];
    numentries = atoi(__nptr);
    if ((int)numentries < 1) {
      fprintf(_stderr,"Bad entry count \'%s\'\n",__nptr);
      return 1;
    }
  }
  uVar2 = (ulong)numentries;
  halfs = (uint16_t *)operator_new__(uVar2 * 2);
  floats = (float *)operator_new__(uVar2 * 4);
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = Imath_3_2::nrand48(r._state);
    halfs[uVar3] = uVar1;
    floats[uVar3] = *(float *)(_imath_half_to_float_table + (ulong)uVar1 * 4);
  }
  perf_test_half_to_float(floats,halfs,numentries);
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar4 = Imath_3_2::Rand48::nextf(&r,-65504.0,65504.0);
    floats[uVar3] = (float)dVar4;
  }
  perf_test_float_to_half(halfs,floats,numentries);
  operator_delete__(halfs);
  operator_delete__(floats);
  return 0;
}

Assistant:

int
main (int argc, char* argv[])
{
    int ret        = 0;
    int numentries = 1920 * 1080 * 3;
    if (argc > 1)
    {
        numentries = atoi (argv[1]);

        if (numentries <= 0)
        {
            fprintf (stderr, "Bad entry count '%s'\n", argv[1]);
            ret = 1;
        }
    }

    if (numentries > 0)
    {
        uint16_t* halfs  = new uint16_t[numentries];
        float*    floats = new float[numentries];

        if (halfs && floats)
        {
            Rand48 r(numentries);
            for (int i = 0; i < numentries; ++i)
            {
                halfs[i]  = (uint16_t) r.nexti();
                floats[i] = imath_half_to_float (halfs[i]);
            }
            perf_test_half_to_float (floats, halfs, numentries);

            // test float -> half with real-world values
            for (int i = 0; i < numentries; ++i)
                floats[i] = float(r.nextf(-65504, 65504));
            perf_test_float_to_half (halfs, floats, numentries);
        }

        delete[] halfs;
        delete[] floats;
    }

    return ret;
}